

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synthesis.cpp
# Opt level: O1

void Synthesis(double *f0,int f0_length,double **spectrogram,double **aperiodicity,int fft_size,
              double frame_period,int fs,int y_length,double *y)

{
  undefined8 uVar1;
  int iVar2;
  fft_plan p;
  fft_plan p_00;
  fft_plan p_01;
  uint uVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  void *pvVar9;
  double *yi;
  void *pvVar10;
  double *pdVar11;
  double *pdVar12;
  double *pdVar13;
  double *yi_00;
  double *pdVar14;
  void *pvVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  long lVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  int current_frame_floor;
  int iVar24;
  uint uVar25;
  fft_plan *pfVar26;
  ulong uVar27;
  undefined8 *puVar28;
  long lVar29;
  ulong uVar30;
  ulong uVar31;
  byte bVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double interpolation;
  double dVar43;
  RandnState randn_state;
  InverseRealFFT inverse_real_fft;
  MinimumPhaseAnalysis minimum_phase;
  ForwardRealFFT forward_real_fft;
  undefined8 auStackY_318 [5];
  undefined1 in_stack_fffffffffffffd10 [40];
  undefined4 uVar44;
  undefined4 uVar45;
  undefined4 uVar46;
  double *pdVar47;
  ulong local_2a0;
  RandnState local_1b8;
  InverseRealFFT local_1a8;
  MinimumPhaseAnalysis local_148;
  ForwardRealFFT local_98;
  
  bVar32 = 0;
  local_1b8.g_randn_x = 0;
  local_1b8.g_randn_y = 0;
  local_1b8.g_randn_z = 0;
  local_1b8.g_randn_w = 0;
  randn_reseed(&local_1b8);
  uVar46 = 0;
  uVar27 = (long)fft_size * 8;
  if (fft_size < 0) {
    uVar27 = 0xffffffffffffffff;
  }
  pvVar6 = operator_new__(uVar27);
  uVar18 = (ulong)(uint)y_length;
  if (0 < y_length) {
    memset(y,0,uVar18 * 8);
  }
  memset(&local_148,0,0xb0);
  uVar22 = fft_size;
  InitializeMinimumPhaseAnalysis(fft_size,&local_148);
  local_1a8.inverse_fft.ip = (int *)0x0;
  local_1a8.inverse_fft.w = (double *)0x0;
  local_1a8.inverse_fft.out = (double *)0x0;
  local_1a8.inverse_fft.input = (double *)0x0;
  local_1a8.inverse_fft.in = (double *)0x0;
  local_1a8.inverse_fft.c_out = (fft_complex *)0x0;
  local_1a8.inverse_fft.flags = 0;
  local_1a8.inverse_fft._12_4_ = 0;
  local_1a8.inverse_fft.c_in = (fft_complex *)0x0;
  local_1a8.spectrum = (fft_complex *)0x0;
  local_1a8.inverse_fft.n = 0;
  local_1a8.inverse_fft.sign = 0;
  local_1a8.fft_size = 0;
  local_1a8._4_4_ = 0;
  local_1a8.waveform = (double *)0x0;
  InitializeInverseRealFFT(fft_size,&local_1a8);
  local_98.forward_fft.ip = (int *)0x0;
  local_98.forward_fft.w = (double *)0x0;
  local_98.forward_fft.out = (double *)0x0;
  local_98.forward_fft.input = (double *)0x0;
  local_98.forward_fft.in = (double *)0x0;
  local_98.forward_fft.c_out = (fft_complex *)0x0;
  local_98.forward_fft.flags = 0;
  local_98.forward_fft._12_4_ = 0;
  local_98.forward_fft.c_in = (fft_complex *)0x0;
  local_98.spectrum = (fft_complex *)0x0;
  local_98.forward_fft.n = 0;
  local_98.forward_fft.sign = 0;
  local_98.fft_size = 0;
  local_98._4_4_ = 0;
  local_98.waveform = (double *)0x0;
  InitializeForwardRealFFT(fft_size,&local_98);
  uVar30 = (long)y_length * 8;
  uVar31 = (long)y_length << 2;
  if (y_length < 0) {
    uVar30 = 0xffffffffffffffff;
    uVar31 = 0xffffffffffffffff;
  }
  pvVar7 = operator_new__(uVar30);
  pvVar8 = operator_new__(uVar31);
  pvVar9 = operator_new__(uVar30);
  yi = (double *)operator_new__(uVar30);
  uVar33 = (undefined4)uVar30;
  uVar34 = (undefined4)(uVar30 >> 0x20);
  pvVar10 = operator_new__(uVar30);
  lVar29 = (long)f0_length;
  uVar30 = lVar29 * 8 + 8;
  if (f0_length < -1) {
    uVar30 = 0xffffffffffffffff;
  }
  pdVar11 = (double *)operator_new__(uVar30);
  pdVar12 = (double *)operator_new__(uVar30);
  pdVar13 = (double *)operator_new__(uVar30);
  dVar35 = (double)fs;
  if (0 < y_length) {
    uVar30 = 0;
    do {
      *(double *)((long)pvVar10 + uVar30 * 8) = (double)(int)uVar30 / dVar35;
      uVar30 = uVar30 + 1;
    } while (uVar18 != uVar30);
  }
  uVar44 = SUB84(pvVar10,0);
  uVar45 = (undefined4)((ulong)pvVar10 >> 0x20);
  dVar42 = frame_period / 1000.0;
  if (0 < f0_length) {
    uVar30 = 0;
    do {
      pdVar11[uVar30] = (double)(int)uVar30 * dVar42;
      dVar40 = (double)(~-(ulong)(f0[uVar30] < (double)(fs / fft_size) + 1.0) & (ulong)f0[uVar30]);
      pdVar12[uVar30] = dVar40;
      pdVar13[uVar30] = (double)(~-(ulong)(dVar40 == 0.0) & 0x3ff0000000000000);
      uVar30 = uVar30 + 1;
    } while ((uint)f0_length != uVar30);
  }
  pdVar11[lVar29] = (double)f0_length * dVar42;
  pdVar12[lVar29] = (pdVar12[lVar29 + -1] + pdVar12[lVar29 + -1]) - pdVar12[lVar29 + -2];
  pdVar13[lVar29] = (pdVar13[lVar29 + -1] + pdVar13[lVar29 + -1]) - pdVar13[lVar29 + -2];
  pdVar47 = pdVar12;
  yi_00 = (double *)operator_new__(CONCAT44(uVar34,uVar33));
  pdVar14 = (double *)CONCAT44(uVar45,uVar44);
  interp1(pdVar11,pdVar12,f0_length + 1,pdVar14,y_length,yi_00);
  interp1(pdVar11,pdVar13,f0_length + 1,pdVar14,y_length,yi);
  if (0 < y_length) {
    uVar30 = 0;
    do {
      dVar41 = (double)(-(ulong)(0.5 < yi[uVar30]) & 0x3ff0000000000000);
      yi[uVar30] = dVar41;
      dVar40 = 500.0;
      if ((dVar41 != 0.0) || (NAN(dVar41))) {
        dVar40 = yi_00[uVar30];
      }
      yi_00[uVar30] = dVar40;
      uVar30 = uVar30 + 1;
    } while (uVar18 != uVar30);
  }
  pdVar12 = (double *)operator_new__(CONCAT44(uVar34,uVar33));
  pdVar14 = (double *)operator_new__(CONCAT44(uVar34,uVar33));
  uVar3 = y_length - 1;
  uVar30 = 0xffffffffffffffff;
  if (0 < y_length) {
    uVar30 = (long)(int)uVar3 << 3;
  }
  pvVar15 = operator_new__(uVar30);
  dVar40 = (*yi_00 * 6.283185307179586) / dVar35;
  *pdVar12 = dVar40;
  dVar40 = fmod(dVar40,6.283185307179586);
  *pdVar14 = dVar40;
  local_2a0 = 0;
  pvVar10 = (void *)CONCAT44(uVar45,uVar44);
  if (1 < y_length) {
    lVar29 = 0;
    do {
      dVar40 = (yi_00[lVar29 + 1] * 6.283185307179586) / dVar35 + pdVar12[lVar29];
      pdVar12[lVar29 + 1] = dVar40;
      dVar40 = fmod(dVar40,6.283185307179586);
      pdVar14[lVar29 + 1] = dVar40;
      *(double *)((long)pvVar15 + lVar29 * 8) = ABS(dVar40 - pdVar14[lVar29]);
      lVar29 = lVar29 + 1;
    } while (uVar18 - 1 != lVar29);
    uVar18 = 0;
    local_2a0 = 0;
    pvVar10 = (void *)CONCAT44(uVar45,uVar44);
    do {
      if (3.141592653589793 < *(double *)((long)pvVar15 + uVar18 * 8)) {
        lVar29 = (long)(int)local_2a0;
        *(undefined8 *)((long)pvVar7 + lVar29 * 8) = *(undefined8 *)((long)pvVar10 + uVar18 * 8);
        *(int *)((long)pvVar8 + lVar29 * 4) = (int)uVar18;
        *(double *)((long)pvVar9 + lVar29 * 8) =
             (-(pdVar14[uVar18] + -6.283185307179586) /
             (pdVar14[uVar18 + 1] - (pdVar14[uVar18] + -6.283185307179586))) / dVar35;
        local_2a0 = (ulong)((int)local_2a0 + 1);
      }
      uVar18 = uVar18 + 1;
    } while (uVar3 != uVar18);
  }
  operator_delete__(pvVar15);
  operator_delete__(pdVar14);
  operator_delete__(pdVar12);
  operator_delete__(pdVar13);
  operator_delete__(pdVar47);
  operator_delete__(pdVar11);
  operator_delete__(pvVar10);
  operator_delete__(yi_00);
  pvVar10 = operator_new__(uVar27);
  uVar20 = (int)(((uint)(CONCAT44(uVar46,uVar22) >> 0x1f) & 1) + uVar22) >> 1;
  dVar41 = 0.0;
  dVar40 = (double)(int)uVar22;
  uVar18 = (ulong)uVar20;
  uVar3 = uVar22;
  if (1 < (int)uVar22) {
    uVar30 = 0;
    do {
      uVar22 = uVar22 - 1;
      uVar33 = SUB84(dVar41,0);
      uVar34 = (undefined4)((ulong)dVar41 >> 0x20);
      uVar31 = uVar30 + 1;
      dVar41 = cos(((double)(uVar31 & 0xffffffff) * 6.283185307179586) / (dVar40 + 1.0));
      dVar41 = dVar41 * -0.5 + 0.5;
      *(double *)((long)pvVar10 + uVar30 * 8) = dVar41;
      *(double *)((long)pvVar10 + (long)(int)uVar22 * 8) = dVar41;
      dVar41 = *(double *)((long)pvVar10 + uVar30 * 8);
      dVar41 = (double)CONCAT44(uVar34,uVar33) + dVar41 + dVar41;
      uVar30 = uVar31;
    } while (uVar18 != uVar31);
  }
  uVar30 = (ulong)uVar3;
  if (1 < (int)uVar3) {
    pdVar11 = (double *)((long)pvVar10 + uVar30 * 8);
    uVar31 = 0;
    do {
      pdVar11 = pdVar11 + -1;
      dVar37 = *(double *)((long)pvVar10 + uVar31 * 8) / dVar41;
      *(double *)((long)pvVar10 + uVar31 * 8) = dVar37;
      *pdVar11 = dVar37;
      uVar31 = uVar31 + 1;
    } while (uVar18 != uVar31);
  }
  if (0 < (int)local_2a0) {
    iVar4 = f0_length + -1;
    uVar23 = (ulong)(uVar20 + 1);
    uVar31 = 0;
    do {
      uVar16 = uVar31 + 1;
      iVar2 = (int)uVar16;
      if ((int)local_2a0 + -1 < (int)uVar16) {
        iVar2 = (int)local_2a0 + -1;
      }
      iVar2 = *(int *)((long)pvVar8 + (long)iVar2 * 4);
      iVar17 = *(int *)((long)pvVar8 + uVar31 * 4);
      dVar41 = yi[iVar17];
      uVar1 = *(undefined8 *)((long)pvVar7 + uVar31 * 8);
      uVar33 = (undefined4)uVar1;
      uVar34 = (undefined4)((ulong)uVar1 >> 0x20);
      pdVar11 = *(double **)((long)pvVar9 + uVar31 * 8);
      pdVar12 = (double *)operator_new__(uVar27);
      pvVar15 = operator_new__(uVar27);
      uVar44 = SUB84(pvVar15,0);
      uVar45 = (undefined4)((ulong)pvVar15 >> 0x20);
      pvVar15 = operator_new__(uVar27);
      pdVar13 = (double *)operator_new__(uVar27);
      dVar37 = (double)CONCAT44(uVar34,uVar33) / dVar42;
      dVar43 = floor(dVar37);
      iVar24 = (int)dVar43;
      if (iVar4 < (int)dVar43) {
        iVar24 = iVar4;
      }
      dVar43 = ceil(dVar37);
      iVar5 = (int)dVar43;
      if (iVar4 < (int)dVar43) {
        iVar5 = iVar4;
      }
      dVar43 = dVar37 - (double)iVar24;
      if (iVar24 == iVar5) {
        if (-2 < (int)uVar3) {
          pdVar14 = spectrogram[iVar24];
          uVar21 = 0;
          do {
            *(double *)((long)pvVar15 + uVar21 * 8) = ABS(pdVar14[uVar21]);
            uVar21 = uVar21 + 1;
          } while (uVar23 != uVar21);
        }
      }
      else if (-2 < (int)uVar3) {
        pdVar14 = spectrogram[iVar24];
        pdVar47 = spectrogram[iVar5];
        uVar21 = 0;
        do {
          *(double *)((long)pvVar15 + uVar21 * 8) =
               ABS(pdVar14[uVar21]) * (1.0 - dVar43) + ABS(pdVar47[uVar21]) * dVar43;
          uVar21 = uVar21 + 1;
        } while (uVar23 != uVar21);
      }
      if (iVar24 == iVar5) {
        if (-2 < (int)uVar3) {
          pdVar14 = aperiodicity[iVar24];
          uVar21 = 0;
          do {
            uVar33 = 0xffffdcd1;
            uVar34 = 0x3fefffff;
            dVar43 = pdVar14[uVar21];
            if (dVar43 <= 0.999999999999) {
              uVar33 = SUB84(dVar43,0);
              uVar34 = (undefined4)((ulong)dVar43 >> 0x20);
            }
            dVar43 = 0.001;
            if (0.001 <= (double)CONCAT44(uVar34,uVar33)) {
              dVar43 = (double)CONCAT44(uVar34,uVar33);
            }
            pdVar13[uVar21] = dVar43 * dVar43;
            uVar21 = uVar21 + 1;
          } while (uVar23 != uVar21);
        }
      }
      else if (-2 < (int)uVar3) {
        pdVar14 = aperiodicity[iVar24];
        pdVar47 = aperiodicity[iVar5];
        uVar21 = 0;
        do {
          dVar39 = 0.999999999999;
          if (pdVar14[uVar21] <= 0.999999999999) {
            dVar39 = pdVar14[uVar21];
          }
          dVar36 = 0.001;
          if (0.001 <= dVar39) {
            dVar36 = dVar39;
          }
          dVar39 = 0.999999999999;
          if (pdVar47[uVar21] <= 0.999999999999) {
            dVar39 = pdVar47[uVar21];
          }
          dVar38 = 0.001;
          if (0.001 <= dVar39) {
            dVar38 = dVar39;
          }
          dVar39 = dVar38 * dVar43 + dVar36 * (1.0 - dVar43);
          pdVar13[uVar21] = dVar39 * dVar39;
          uVar21 = uVar21 + 1;
        } while (uVar23 != uVar21);
      }
      if ((dVar41 <= 0.5) || (0.999 < *pdVar13)) {
        if (0 < (int)uVar3) {
          memset((void *)CONCAT44(uVar45,uVar44),0,uVar30 * 8);
        }
      }
      else {
        uVar22 = uVar3;
        if (-2 < local_148.fft_size) {
          lVar29 = -1;
          do {
            dVar43 = log((1.0 - pdVar13[lVar29 + 1]) * *(double *)((long)pvVar15 + lVar29 * 8 + 8) +
                         1e-12);
            local_148.log_spectrum[lVar29 + 1] = dVar43 * 0.5;
            lVar29 = lVar29 + 1;
          } while (lVar29 < local_148.fft_size / 2);
        }
        GetMinimumPhaseSpectrum(&local_148);
        if (-2 < (int)uVar22) {
          lVar29 = 0;
          do {
            *(undefined8 *)((long)*local_1a8.spectrum + lVar29) =
                 *(undefined8 *)((long)*local_148.minimum_phase_spectrum + lVar29);
            *(undefined8 *)((long)*local_1a8.spectrum + lVar29 + 8) =
                 *(undefined8 *)((long)*local_148.minimum_phase_spectrum + lVar29 + 8);
            lVar29 = lVar29 + 0x10;
          } while (uVar23 << 4 != lVar29);
        }
        pdVar11 = (double *)((double)pdVar11 * 6.283185307179586);
        if (-2 < (int)uVar22) {
          pdVar11 = (double *)(((double)pdVar11 * dVar35) / dVar40);
          lVar29 = 8;
          uVar21 = 0;
          do {
            dVar43 = *(double *)((long)local_1a8.spectrum[-1] + lVar29 + 8);
            uVar1 = *(undefined8 *)((long)*local_1a8.spectrum + lVar29);
            uVar33 = (undefined4)uVar1;
            uVar34 = (undefined4)((ulong)uVar1 >> 0x20);
            dVar39 = cos((double)(int)uVar21 * (double)pdVar11);
            dVar36 = 1.0 - dVar39 * dVar39;
            if (dVar36 < 0.0) {
              dVar36 = sqrt(dVar36);
            }
            else {
              dVar36 = SQRT(dVar36);
            }
            dVar37 = (double)CONCAT44(uVar34,uVar33);
            *(double *)((long)local_1a8.spectrum[-1] + lVar29 + 8) =
                 dVar43 * dVar39 + dVar37 * dVar36;
            *(double *)((long)*local_1a8.spectrum + lVar29) = dVar37 * dVar39 - dVar36 * dVar43;
            uVar21 = uVar21 + 1;
            lVar29 = lVar29 + 0x10;
          } while (uVar23 != uVar21);
        }
        lVar29 = 9;
        pfVar26 = &local_1a8.inverse_fft;
        puVar28 = auStackY_318;
        while( true ) {
          if (lVar29 == 0) break;
          lVar29 = lVar29 + -1;
          *puVar28 = *(undefined8 *)pfVar26;
          pfVar26 = (fft_plan *)((long)pfVar26 + ((ulong)bVar32 * -2 + 1) * 8);
          puVar28 = puVar28 + (ulong)bVar32 * -2 + 1;
        }
        p.out._0_4_ = SUB84(dVar37,0);
        p.n = in_stack_fffffffffffffd10._0_4_;
        p.sign = in_stack_fffffffffffffd10._4_4_;
        p.flags = in_stack_fffffffffffffd10._8_4_;
        p._12_4_ = in_stack_fffffffffffffd10._12_4_;
        p.c_in = (fft_complex *)in_stack_fffffffffffffd10._16_8_;
        p.in = (double *)in_stack_fffffffffffffd10._24_8_;
        p.c_out = (fft_complex *)in_stack_fffffffffffffd10._32_8_;
        p.out._4_4_ = (int)((ulong)dVar37 >> 0x20);
        p.input._0_4_ = uVar22;
        p.input._4_4_ = uVar46;
        p.ip._0_4_ = uVar44;
        p.ip._4_4_ = uVar45;
        p.w = pdVar11;
        fft_execute(p);
        uVar3 = uVar22;
        fftshift(local_1a8.waveform,uVar22,(double *)CONCAT44(uVar45,uVar44));
        dVar37 = 0.0;
        dVar43 = 0.0;
        if (0 < (int)uVar22) {
          uVar21 = uVar18;
          do {
            dVar37 = dVar37 + *(double *)(CONCAT44(uVar45,uVar44) + uVar21 * 8);
            uVar21 = uVar21 + 1;
            dVar43 = dVar37;
          } while (uVar21 < uVar30);
        }
        if (1 < (int)uVar22) {
          uVar21 = 0;
          do {
            *(double *)(CONCAT44(uVar45,uVar44) + uVar21 * 8) =
                 *(double *)((long)pvVar10 + uVar21 * 8) * -dVar43;
            uVar21 = uVar21 + 1;
          } while (uVar18 != uVar21);
        }
        if (0 < (int)uVar22) {
          lVar29 = CONCAT44(uVar45,uVar44) + uVar18 * 8;
          lVar19 = 0;
          do {
            *(double *)(lVar29 + lVar19 * 8) =
                 *(double *)((long)pvVar10 + lVar19 * 8 + uVar18 * 8) * -dVar43 +
                 *(double *)(lVar29 + lVar19 * 8);
            lVar19 = lVar19 + 1;
          } while ((int)((int)lVar19 + uVar20) < (int)uVar22);
        }
      }
      uVar22 = iVar2 - iVar17;
      dVar37 = 0.0;
      if (0 < (int)uVar22) {
        uVar21 = 0;
        do {
          uVar33 = SUB84(dVar37,0);
          uVar34 = (undefined4)((ulong)dVar37 >> 0x20);
          dVar37 = randn(&local_1b8);
          local_98.waveform[uVar21] = dVar37;
          dVar37 = (double)CONCAT44(uVar34,uVar33) + dVar37;
          uVar21 = uVar21 + 1;
        } while (uVar22 != uVar21);
      }
      dVar43 = (double)(int)uVar22;
      if (0 < (int)uVar22) {
        uVar21 = 0;
        do {
          local_98.waveform[uVar21] = local_98.waveform[uVar21] - dVar37 / dVar43;
          uVar21 = uVar21 + 1;
        } while (uVar22 != uVar21);
      }
      if ((int)uVar22 < (int)uVar3) {
        memset(local_98.waveform + (int)uVar22,0,(ulong)(~uVar22 + uVar3) * 8 + 8);
      }
      lVar29 = 9;
      pfVar26 = &local_98.forward_fft;
      puVar28 = auStackY_318;
      while( true ) {
        if (lVar29 == 0) break;
        lVar29 = lVar29 + -1;
        *puVar28 = *(undefined8 *)pfVar26;
        pfVar26 = (fft_plan *)((long)pfVar26 + ((ulong)bVar32 * -2 + 1) * 8);
        puVar28 = puVar28 + (ulong)bVar32 * -2 + 1;
      }
      p_00.out._0_4_ = SUB84(dVar43,0);
      p_00.n = in_stack_fffffffffffffd10._0_4_;
      p_00.sign = in_stack_fffffffffffffd10._4_4_;
      p_00.flags = in_stack_fffffffffffffd10._8_4_;
      p_00._12_4_ = in_stack_fffffffffffffd10._12_4_;
      p_00.c_in = (fft_complex *)in_stack_fffffffffffffd10._16_8_;
      p_00.in = (double *)in_stack_fffffffffffffd10._24_8_;
      p_00.c_out = (fft_complex *)in_stack_fffffffffffffd10._32_8_;
      p_00.out._4_4_ = (int)((ulong)dVar43 >> 0x20);
      p_00.input._0_4_ = uVar3;
      p_00.input._4_4_ = uVar46;
      p_00.ip._0_4_ = uVar44;
      p_00.ip._4_4_ = uVar45;
      p_00.w = pdVar11;
      fft_execute(p_00);
      if ((dVar41 != 0.0) || (NAN(dVar41))) {
        if (-2 < local_148.fft_size) {
          lVar29 = -1;
          do {
            dVar41 = log(*(double *)((long)pvVar15 + lVar29 * 8 + 8) * pdVar13[lVar29 + 1]);
            local_148.log_spectrum[lVar29 + 1] = dVar41 * 0.5;
            lVar29 = lVar29 + 1;
          } while (lVar29 < local_148.fft_size / 2);
        }
      }
      else if (-2 < local_148.fft_size) {
        lVar29 = -1;
        do {
          dVar41 = log(*(double *)((long)pvVar15 + lVar29 * 8 + 8));
          local_148.log_spectrum[lVar29 + 1] = dVar41 * 0.5;
          lVar29 = lVar29 + 1;
        } while (lVar29 < local_148.fft_size / 2);
      }
      GetMinimumPhaseSpectrum(&local_148);
      if (-2 < (int)uVar3) {
        lVar29 = 0;
        do {
          *(double *)((long)*local_1a8.spectrum + lVar29) =
               *(double *)((long)*local_148.minimum_phase_spectrum + lVar29) *
               *(double *)((long)*local_98.spectrum + lVar29) -
               *(double *)((long)*local_98.spectrum + lVar29 + 8) *
               *(double *)((long)*local_148.minimum_phase_spectrum + lVar29 + 8);
          *(double *)((long)*local_1a8.spectrum + lVar29 + 8) =
               *(double *)((long)*local_148.minimum_phase_spectrum + lVar29) *
               *(double *)((long)*local_98.spectrum + lVar29 + 8) +
               *(double *)((long)*local_148.minimum_phase_spectrum + lVar29 + 8) *
               *(double *)((long)*local_98.spectrum + lVar29);
          lVar29 = lVar29 + 0x10;
        } while (uVar23 << 4 != lVar29);
      }
      lVar29 = 9;
      pfVar26 = &local_1a8.inverse_fft;
      puVar28 = auStackY_318;
      while( true ) {
        if (lVar29 == 0) break;
        lVar29 = lVar29 + -1;
        *puVar28 = *(undefined8 *)pfVar26;
        pfVar26 = (fft_plan *)((long)pfVar26 + ((ulong)bVar32 * -2 + 1) * 8);
        puVar28 = puVar28 + (ulong)bVar32 * -2 + 1;
      }
      p_01.out._0_4_ = SUB84(dVar43,0);
      p_01.n = in_stack_fffffffffffffd10._0_4_;
      p_01.sign = in_stack_fffffffffffffd10._4_4_;
      p_01.flags = in_stack_fffffffffffffd10._8_4_;
      p_01._12_4_ = in_stack_fffffffffffffd10._12_4_;
      p_01.c_in = (fft_complex *)in_stack_fffffffffffffd10._16_8_;
      p_01.in = (double *)in_stack_fffffffffffffd10._24_8_;
      p_01.c_out = (fft_complex *)in_stack_fffffffffffffd10._32_8_;
      p_01.out._4_4_ = (int)((ulong)dVar43 >> 0x20);
      p_01.input._0_4_ = uVar3;
      p_01.input._4_4_ = uVar46;
      p_01.ip._0_4_ = uVar44;
      p_01.ip._4_4_ = uVar45;
      p_01.w = pdVar11;
      fft_execute(p_01);
      fftshift(local_1a8.waveform,uVar3,pdVar12);
      if (dVar43 < 0.0) {
        dVar43 = sqrt(dVar43);
      }
      else {
        dVar43 = SQRT(dVar43);
      }
      if (0 < (int)uVar3) {
        uVar21 = 0;
        do {
          *(double *)((long)pvVar6 + uVar21 * 8) =
               (*(double *)((long)CONCAT44(uVar45,uVar44) + uVar21 * 8) * dVar43 + pdVar12[uVar21])
               / dVar40;
          uVar21 = uVar21 + 1;
        } while (uVar30 != uVar21);
      }
      operator_delete__(pvVar15);
      operator_delete__(pdVar13);
      operator_delete__((void *)CONCAT44(uVar45,uVar44));
      operator_delete__(pdVar12);
      iVar2 = *(int *)((long)pvVar8 + uVar31 * 4);
      iVar17 = iVar2 + -uVar20 + 1;
      uVar22 = iVar2 + -uVar20;
      if (-2 < (int)uVar22) {
        uVar22 = 0xffffffff;
      }
      uVar25 = y_length - iVar17;
      if ((int)uVar3 < y_length - iVar17) {
        uVar25 = uVar3;
      }
      if ((int)~uVar22 < (int)uVar25) {
        uVar31 = (ulong)~uVar22;
        lVar29 = 0;
        do {
          y[(long)iVar17 + uVar31 + lVar29] =
               *(double *)((long)pvVar6 + lVar29 * 8 + uVar31 * 8) +
               y[(long)iVar17 + uVar31 + lVar29];
          lVar29 = lVar29 + 1;
        } while (uVar22 + uVar25 + 1 != (int)lVar29);
      }
      uVar31 = uVar16;
    } while (uVar16 != local_2a0);
  }
  operator_delete__(pvVar10);
  operator_delete__(pvVar7);
  operator_delete__(pvVar8);
  operator_delete__(pvVar9);
  operator_delete__(yi);
  DestroyMinimumPhaseAnalysis(&local_148);
  DestroyInverseRealFFT(&local_1a8);
  DestroyForwardRealFFT(&local_98);
  operator_delete__(pvVar6);
  return;
}

Assistant:

void Synthesis(const double *f0, int f0_length,
    const double * const *spectrogram, const double * const *aperiodicity,
    int fft_size, double frame_period, int fs, int y_length, double *y) {
  RandnState randn_state = {};
  randn_reseed(&randn_state);

  double *impulse_response = new double[fft_size];

  for (int i = 0; i < y_length; ++i) y[i] = 0.0;

  MinimumPhaseAnalysis minimum_phase = {0};
  InitializeMinimumPhaseAnalysis(fft_size, &minimum_phase);
  InverseRealFFT inverse_real_fft = {0};
  InitializeInverseRealFFT(fft_size, &inverse_real_fft);
  ForwardRealFFT forward_real_fft = {0};
  InitializeForwardRealFFT(fft_size, &forward_real_fft);

  double *pulse_locations = new double[y_length];
  int *pulse_locations_index = new int[y_length];
  double *pulse_locations_time_shift = new double[y_length];
  double *interpolated_vuv = new double[y_length];
  int number_of_pulses = GetTimeBase(f0, f0_length, fs, frame_period / 1000.0,
      y_length, fs / fft_size + 1.0, pulse_locations, pulse_locations_index,
      pulse_locations_time_shift, interpolated_vuv);

  double *dc_remover = new double[fft_size];
  GetDCRemover(fft_size, dc_remover);

  frame_period /= 1000.0;
  int noise_size;
  int index, offset, lower_limit, upper_limit;
  for (int i = 0; i < number_of_pulses; ++i) {
    noise_size = pulse_locations_index[MyMinInt(number_of_pulses - 1, i + 1)] -
      pulse_locations_index[i];

    GetOneFrameSegment(interpolated_vuv[pulse_locations_index[i]], noise_size,
        spectrogram, fft_size, aperiodicity, f0_length, frame_period,
        pulse_locations[i], pulse_locations_time_shift[i], fs,
        &forward_real_fft, &inverse_real_fft, &minimum_phase, dc_remover,
        impulse_response, &randn_state);
    offset = pulse_locations_index[i] - fft_size / 2 + 1;
    lower_limit = MyMaxInt(0, -offset);
    upper_limit = MyMinInt(fft_size, y_length - offset);
    for (int j = lower_limit; j < upper_limit; ++j) {
      index = j + offset;
      y[index] += impulse_response[j];
    }
  }

  delete[] dc_remover;
  delete[] pulse_locations;
  delete[] pulse_locations_index;
  delete[] pulse_locations_time_shift;
  delete[] interpolated_vuv;

  DestroyMinimumPhaseAnalysis(&minimum_phase);
  DestroyInverseRealFFT(&inverse_real_fft);
  DestroyForwardRealFFT(&forward_real_fft);

  delete[] impulse_response;
}